

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O3

void get_msurf_descriptor_haar_unroll_2_1_False(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  float *pfVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  float *data;
  ulong uVar22;
  long lVar23;
  float *pfVar24;
  int iVar25;
  long lVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  float *pfVar30;
  float *pfVar31;
  float *pfVar32;
  long lVar33;
  long lVar34;
  int iVar35;
  ulong uVar36;
  int iVar37;
  int iVar38;
  long lVar39;
  int k_count;
  long lVar40;
  long lVar41;
  long lVar42;
  int scale;
  int iVar43;
  int iVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  float fVar58;
  float fVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar71;
  undefined1 auVar72 [12];
  undefined1 in_ZMM8 [64];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar75;
  undefined1 auVar76 [64];
  int data_width;
  int local_b0;
  
  auVar53._8_4_ = 0x3effffff;
  auVar53._0_8_ = 0x3effffff3effffff;
  auVar53._12_4_ = 0x3effffff;
  auVar52._8_4_ = 0x80000000;
  auVar52._0_8_ = 0x8000000080000000;
  auVar52._12_4_ = 0x80000000;
  fVar59 = ipoint->scale;
  auVar76 = ZEXT464((uint)fVar59);
  auVar45 = vpternlogd_avx512vl(auVar53,ZEXT416((uint)fVar59),auVar52,0xf8);
  auVar45 = ZEXT416((uint)(fVar59 + auVar45._0_4_));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  fVar58 = -0.08 / (fVar59 * fVar59);
  scale = (int)auVar45._0_4_;
  auVar46._0_4_ = (int)auVar45._0_4_;
  auVar46._4_4_ = (int)auVar45._4_4_;
  auVar46._8_4_ = (int)auVar45._8_4_;
  auVar46._12_4_ = (int)auVar45._12_4_;
  auVar45 = vcvtdq2ps_avx(auVar46);
  auVar46 = vpternlogd_avx512vl(auVar53,ZEXT416((uint)ipoint->x),auVar52,0xf8);
  auVar46 = ZEXT416((uint)(ipoint->x + auVar46._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar47._0_8_ = (double)auVar46._0_4_;
  auVar47._8_8_ = auVar46._8_8_;
  auVar51._0_8_ = (double)fVar59;
  auVar51._8_8_ = 0;
  auVar46 = vfmadd231sd_fma(auVar47,auVar51,ZEXT816(0x3fe0000000000000));
  auVar50._0_4_ = (float)auVar46._0_8_;
  auVar50._4_12_ = auVar46._4_12_;
  auVar46 = vpternlogd_avx512vl(auVar53,ZEXT416((uint)ipoint->y),auVar52,0xf8);
  fVar4 = auVar50._0_4_ - auVar45._0_4_;
  auVar46 = ZEXT416((uint)(ipoint->y + auVar46._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar48._0_8_ = (double)auVar46._0_4_;
  auVar48._8_8_ = auVar46._8_8_;
  auVar46 = vfmadd231sd_fma(auVar48,auVar51,ZEXT816(0x3fe0000000000000));
  auVar49._0_4_ = (float)auVar46._0_8_;
  auVar49._4_12_ = auVar46._4_12_;
  fVar75 = auVar49._0_4_ - auVar45._0_4_;
  auVar45 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar59),auVar50);
  auVar46 = vpternlogd_avx512vl(auVar53,auVar45,auVar52,0xf8);
  auVar45 = ZEXT416((uint)(auVar45._0_4_ + auVar46._0_4_));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  auVar46 = ZEXT416((uint)fVar59);
  if (scale < (int)auVar45._0_4_) {
    auVar54._8_4_ = 0x3effffff;
    auVar54._0_8_ = 0x3effffff3effffff;
    auVar54._12_4_ = 0x3effffff;
    auVar55._8_4_ = 0x80000000;
    auVar55._0_8_ = 0x8000000080000000;
    auVar55._12_4_ = 0x80000000;
    auVar45 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar46,auVar49);
    auVar47 = vpternlogd_avx512vl(auVar55,auVar45,auVar54,0xea);
    auVar45 = ZEXT416((uint)(auVar45._0_4_ + auVar47._0_4_));
    auVar45 = vroundss_avx(auVar45,auVar45,0xb);
    if (scale < (int)auVar45._0_4_) {
      auVar45 = vfmadd231ss_fma(auVar50,auVar46,ZEXT416(0x41300000));
      auVar56._8_4_ = 0x80000000;
      auVar56._0_8_ = 0x8000000080000000;
      auVar56._12_4_ = 0x80000000;
      auVar47 = vpternlogd_avx512vl(auVar56,auVar45,auVar54,0xea);
      auVar45 = ZEXT416((uint)(auVar45._0_4_ + auVar47._0_4_));
      auVar45 = vroundss_avx(auVar45,auVar45,0xb);
      if ((int)auVar45._0_4_ + scale <= iimage->width) {
        auVar45 = vfmadd231ss_fma(auVar49,auVar46,ZEXT416(0x41300000));
        auVar15._8_4_ = 0x80000000;
        auVar15._0_8_ = 0x8000000080000000;
        auVar15._12_4_ = 0x80000000;
        auVar47 = vpternlogd_avx512vl(auVar54,auVar45,auVar15,0xf8);
        auVar45 = ZEXT416((uint)(auVar45._0_4_ + auVar47._0_4_));
        auVar45 = vroundss_avx(auVar45,auVar45,0xb);
        if ((int)auVar45._0_4_ + scale <= iimage->height) {
          iVar1 = iimage->data_width;
          pfVar31 = iimage->data;
          iVar17 = scale * 2;
          pfVar24 = haarResponseX;
          pfVar30 = haarResponseY;
          uVar18 = 0xfffffff4;
          do {
            auVar45._0_4_ = (float)(int)uVar18;
            auVar72 = in_ZMM8._4_12_;
            auVar45._4_12_ = auVar72;
            lVar23 = 0;
            auVar70._0_4_ = (float)(int)(uVar18 | 1);
            auVar70._4_12_ = auVar72;
            auVar45 = vfmadd213ss_fma(auVar45,auVar46,ZEXT416((uint)(fVar75 + 0.5)));
            auVar47 = vfmadd213ss_fma(auVar70,auVar46,ZEXT416((uint)(fVar75 + 0.5)));
            iVar38 = (int)auVar45._0_4_;
            iVar35 = (int)auVar47._0_4_;
            iVar25 = (iVar38 + -1) * iVar1;
            iVar21 = (iVar38 + -1 + scale) * iVar1;
            iVar38 = (iVar38 + -1 + iVar17) * iVar1;
            iVar27 = (iVar35 + -1) * iVar1;
            iVar28 = (iVar35 + -1 + scale) * iVar1;
            iVar35 = (iVar35 + -1 + iVar17) * iVar1;
            do {
              auVar68._0_4_ = (float)((int)lVar23 + -0xc);
              auVar68._4_12_ = auVar72;
              auVar45 = vfmadd213ss_fma(auVar68,auVar46,ZEXT416((uint)(fVar4 + 0.5)));
              iVar44 = (int)auVar45._0_4_;
              iVar37 = iVar44 + -1 + scale;
              iVar43 = iVar44 + -1 + iVar17;
              fVar59 = pfVar31[iVar38 + -1 + iVar44];
              fVar62 = pfVar31[iVar25 + iVar43];
              auVar48 = SUB6416(ZEXT464(0x40000000),0);
              auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar31[iVar25 + iVar37] -
                                                      pfVar31[iVar38 + iVar37])),auVar48,
                                        ZEXT416((uint)(pfVar31[iVar38 + iVar43] -
                                                      pfVar31[iVar25 + -1 + iVar44])));
              auVar47 = vfmadd213ss_fma(ZEXT416((uint)(pfVar31[iVar21 + -1 + iVar44] -
                                                      pfVar31[iVar21 + iVar43])),auVar48,
                                        ZEXT416((uint)(pfVar31[iVar38 + iVar43] -
                                                      pfVar31[iVar25 + -1 + iVar44])));
              pfVar24[lVar23] = (fVar59 - fVar62) + auVar45._0_4_;
              pfVar30[lVar23] = auVar47._0_4_ - (fVar59 - fVar62);
              fVar59 = pfVar31[iVar35 + -1 + iVar44];
              fVar62 = pfVar31[iVar27 + iVar43];
              auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar31[iVar28 + -1 + iVar44] -
                                                      pfVar31[iVar28 + iVar43])),auVar48,
                                        ZEXT416((uint)(pfVar31[iVar43 + iVar35] -
                                                      pfVar31[iVar27 + -1 + iVar44])));
              auVar47 = vfmadd213ss_fma(ZEXT416((uint)(pfVar31[iVar27 + iVar37] -
                                                      pfVar31[iVar37 + iVar35])),auVar48,
                                        ZEXT416((uint)(pfVar31[iVar43 + iVar35] -
                                                      pfVar31[iVar27 + -1 + iVar44])));
              pfVar24[lVar23 + 0x18] = (fVar59 - fVar62) + auVar47._0_4_;
              pfVar30[lVar23 + 0x18] = auVar45._0_4_ - (fVar59 - fVar62);
              lVar23 = lVar23 + 1;
            } while (lVar23 != 0x18);
            pfVar30 = pfVar30 + 0x30;
            pfVar24 = pfVar24 + 0x30;
            bVar3 = (int)uVar18 < 10;
            uVar18 = uVar18 + 2;
          } while (bVar3);
          goto LAB_001afc9a;
        }
      }
    }
  }
  iVar1 = scale * 2;
  lVar23 = 0;
  uVar18 = 0xfffffff4;
  do {
    auVar60._0_4_ = (float)(int)uVar18;
    auVar60._4_12_ = in_ZMM8._4_12_;
    iVar38 = -0xc;
    auVar63._0_4_ = (float)(int)(uVar18 | 1);
    auVar63._4_12_ = in_ZMM8._4_12_;
    auVar45 = vfmadd213ss_fma(auVar60,auVar76._0_16_,ZEXT416((uint)fVar75));
    auVar47 = vfmadd213ss_fma(auVar63,auVar76._0_16_,ZEXT416((uint)fVar75));
    fVar59 = auVar45._0_4_;
    fVar62 = auVar47._0_4_;
    lVar41 = 0;
    iVar17 = (int)((double)((ulong)(0.0 <= fVar59) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar59) * -0x4020000000000000) + (double)fVar59);
    iVar21 = (int)((double)((ulong)(0.0 <= fVar62) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar62) * -0x4020000000000000) + (double)fVar62);
    pfVar31 = haarResponseX;
    pfVar24 = haarResponseY;
    do {
      auVar61._0_4_ = (float)iVar38;
      auVar61._4_12_ = in_ZMM8._4_12_;
      auVar45 = vfmadd213ss_fma(auVar61,auVar76._0_16_,ZEXT416((uint)fVar4));
      fVar59 = auVar45._0_4_;
      pfVar30 = (float *)((long)pfVar31 + lVar41 + lVar23);
      pfVar32 = (float *)((long)pfVar24 + lVar41 + lVar23);
      iVar25 = (int)((double)((ulong)(0.0 <= fVar59) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar59) * -0x4020000000000000) + (double)fVar59);
      if (((iVar17 < 1) || (iVar25 < 1)) || (iimage->height < iVar1 + iVar17)) {
LAB_001afa4b:
        haarXY(iimage,iVar17,iVar25,scale,pfVar30,pfVar32);
        iVar35 = iimage->width;
        pfVar31 = haarResponseX;
        pfVar24 = haarResponseY;
      }
      else {
        iVar35 = iimage->width;
        iVar27 = iVar1 + iVar25;
        if (iVar35 < iVar27) goto LAB_001afa4b;
        iVar28 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar43 = iVar25 + -1 + scale;
        iVar37 = iVar28 * (iVar17 + -1);
        iVar44 = iVar28 * (iVar17 + -1 + scale);
        iVar28 = iVar28 * (iVar1 + -1 + iVar17);
        fVar59 = pfVar2[iVar28 + -1 + iVar25];
        fVar62 = pfVar2[iVar37 + -1 + iVar27];
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar37 + iVar43] - pfVar2[iVar28 + iVar43]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar28 + -1 + iVar27] -
                                                pfVar2[iVar37 + -1 + iVar25])));
        auVar47 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar44 + -1 + iVar25] -
                                                pfVar2[iVar44 + -1 + iVar27])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar28 + -1 + iVar27] -
                                                pfVar2[iVar37 + -1 + iVar25])));
        *pfVar30 = (fVar59 - fVar62) + auVar45._0_4_;
        *pfVar32 = auVar47._0_4_ - (fVar59 - fVar62);
      }
      pfVar30 = (float *)((long)pfVar31 + lVar41 + 0x60 + lVar23);
      pfVar32 = (float *)((long)pfVar24 + lVar41 + 0x60 + lVar23);
      if (((iVar21 < 1) || (iVar25 < 1)) ||
         ((iimage->height < iVar1 + iVar21 || (iVar27 = iVar1 + iVar25, iVar35 < iVar27)))) {
        haarXY(iimage,iVar21,iVar25,scale,pfVar30,pfVar32);
        pfVar31 = haarResponseX;
        pfVar24 = haarResponseY;
      }
      else {
        iVar35 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar28 = iVar25 + -1 + scale;
        iVar37 = iVar35 * (iVar21 + -1);
        iVar44 = iVar35 * (iVar21 + -1 + scale);
        iVar35 = iVar35 * (iVar1 + -1 + iVar21);
        fVar59 = pfVar2[iVar35 + -1 + iVar25];
        fVar62 = pfVar2[iVar37 + -1 + iVar27];
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar37 + iVar28] - pfVar2[iVar35 + iVar28]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar35 + -1 + iVar27] -
                                                pfVar2[iVar37 + -1 + iVar25])));
        auVar47 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar44 + -1 + iVar25] -
                                                pfVar2[iVar44 + -1 + iVar27])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar35 + -1 + iVar27] -
                                                pfVar2[iVar37 + -1 + iVar25])));
        *pfVar30 = (fVar59 - fVar62) + auVar45._0_4_;
        *pfVar32 = auVar47._0_4_ - (fVar59 - fVar62);
      }
      auVar76 = ZEXT1664(auVar46);
      iVar38 = iVar38 + 1;
      lVar41 = lVar41 + 4;
    } while (lVar41 != 0x60);
    lVar23 = lVar23 + 0xc0;
    bVar3 = (int)uVar18 < 10;
    uVar18 = uVar18 + 2;
  } while (bVar3);
LAB_001afc9a:
  fVar75 = auVar76._0_4_;
  auVar74._8_4_ = 0x3effffff;
  auVar74._0_8_ = 0x3effffff3effffff;
  auVar74._12_4_ = 0x3effffff;
  auVar73._8_4_ = 0x80000000;
  auVar73._0_8_ = 0x8000000080000000;
  auVar73._12_4_ = 0x80000000;
  auVar45 = vpternlogd_avx512vl(auVar74,ZEXT416((uint)(fVar75 * 0.5)),auVar73,0xf8);
  auVar45 = ZEXT416((uint)(fVar75 * 0.5 + auVar45._0_4_));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  auVar46 = vpternlogd_avx512vl(auVar74,ZEXT416((uint)(fVar75 * 1.5)),auVar73,0xf8);
  auVar46 = ZEXT416((uint)(fVar75 * 1.5 + auVar46._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar47 = vpternlogd_avx512vl(auVar74,ZEXT416((uint)(fVar75 * 2.5)),auVar73,0xf8);
  auVar47 = ZEXT416((uint)(fVar75 * 2.5 + auVar47._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar48 = vpternlogd_avx512vl(auVar74,ZEXT416((uint)(fVar75 * 3.5)),auVar73,0xf8);
  auVar48 = ZEXT416((uint)(fVar75 * 3.5 + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49 = vpternlogd_avx512vl(auVar74,ZEXT416((uint)(fVar75 * 4.5)),auVar73,0xf8);
  auVar49 = ZEXT416((uint)(fVar75 * 4.5 + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50 = vpternlogd_avx512vl(auVar74,ZEXT416((uint)(fVar75 * 5.5)),auVar73,0xf8);
  auVar50 = ZEXT416((uint)(fVar75 * 5.5 + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar51 = vpternlogd_avx512vl(auVar74,ZEXT416((uint)(fVar75 * 6.5)),auVar73,0xf8);
  auVar51 = ZEXT416((uint)(fVar75 * 6.5 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52 = vpternlogd_avx512vl(auVar74,ZEXT416((uint)(fVar75 * 7.5)),auVar73,0xf8);
  auVar52 = ZEXT416((uint)(auVar52._0_4_ + fVar75 * 7.5));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53 = vpternlogd_avx512vl(auVar74,ZEXT416((uint)(fVar75 * 8.5)),auVar73,0xf8);
  auVar53 = ZEXT416((uint)(fVar75 * 8.5 + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = vpternlogd_avx512vl(auVar74,ZEXT416((uint)(fVar75 * 9.5)),auVar73,0xf8);
  auVar54 = ZEXT416((uint)(fVar75 * 9.5 + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = vpternlogd_avx512vl(auVar74,ZEXT416((uint)(fVar75 * 10.5)),auVar73,0xf8);
  auVar55 = ZEXT416((uint)(fVar75 * 10.5 + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = vpternlogd_avx512vl(auVar74,ZEXT416((uint)(fVar75 * 11.5)),auVar73,0xf8);
  fVar65 = auVar47._0_4_;
  fVar59 = fVar65 + auVar46._0_4_;
  fVar4 = fVar65 + auVar45._0_4_;
  auVar47 = ZEXT416((uint)(fVar75 * 11.5 + auVar56._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  fVar75 = fVar65 - auVar45._0_4_;
  fVar62 = fVar65 - auVar46._0_4_;
  fVar5 = fVar65 - auVar48._0_4_;
  fVar6 = fVar65 - auVar49._0_4_;
  fVar7 = fVar65 - auVar50._0_4_;
  fVar65 = fVar65 - auVar51._0_4_;
  fVar71 = auVar52._0_4_;
  fVar8 = fVar71 - auVar48._0_4_;
  fVar9 = fVar71 - auVar49._0_4_;
  fVar10 = fVar71 - auVar50._0_4_;
  fVar11 = fVar71 - auVar51._0_4_;
  fVar12 = fVar71 - auVar53._0_4_;
  fVar13 = fVar71 - auVar54._0_4_;
  fVar14 = fVar71 - auVar55._0_4_;
  fVar71 = fVar71 - auVar47._0_4_;
  gauss_s1_c0[0] = expf(fVar59 * fVar59 * fVar58);
  gauss_s1_c0[1] = expf(fVar4 * fVar4 * fVar58);
  gauss_s1_c0[2] = expf(fVar75 * fVar75 * fVar58);
  gauss_s1_c0[3] = expf(fVar62 * fVar62 * fVar58);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar5 * fVar5 * fVar58);
  gauss_s1_c0[6] = expf(fVar6 * fVar6 * fVar58);
  gauss_s1_c0[7] = expf(fVar7 * fVar7 * fVar58);
  gauss_s1_c0[8] = expf(fVar65 * fVar65 * fVar58);
  gauss_s1_c1[0] = expf(fVar8 * fVar8 * fVar58);
  gauss_s1_c1[1] = expf(fVar9 * fVar9 * fVar58);
  gauss_s1_c1[2] = expf(fVar10 * fVar10 * fVar58);
  gauss_s1_c1[3] = expf(fVar11 * fVar11 * fVar58);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar12 * fVar12 * fVar58);
  gauss_s1_c1[6] = expf(fVar13 * fVar13 * fVar58);
  gauss_s1_c1[7] = expf(fVar14 * fVar14 * fVar58);
  gauss_s1_c1[8] = expf(fVar71 * fVar71 * fVar58);
  auVar64._8_4_ = 0x7fffffff;
  auVar64._0_8_ = 0x7fffffff7fffffff;
  auVar64._12_4_ = 0x7fffffff;
  uVar19 = 0xfffffff8;
  fVar59 = 0.0;
  lVar23 = 0;
  lVar41 = 0;
  local_b0 = 0;
  do {
    pfVar31 = gauss_s1_c1;
    uVar18 = (uint)uVar19;
    if (uVar18 != 7) {
      pfVar31 = gauss_s1_c0;
    }
    lVar39 = (long)local_b0;
    lVar41 = (long)(int)lVar41;
    if (uVar18 == 0xfffffff8) {
      pfVar31 = gauss_s1_c1;
    }
    uVar36 = 0;
    local_b0 = local_b0 + 4;
    uVar29 = 0xfffffff8;
    lVar33 = (long)haarResponseX + lVar23;
    lVar42 = (long)haarResponseY + lVar23;
    do {
      pfVar24 = gauss_s1_c1;
      if (uVar29 != 7) {
        pfVar24 = gauss_s1_c0;
      }
      auVar76 = ZEXT1664(ZEXT816(0) << 0x40);
      if (uVar29 == 0xfffffff8) {
        pfVar24 = gauss_s1_c1;
      }
      uVar20 = (ulong)(uVar29 >> 0x1c & 0xfffffff8);
      uVar22 = uVar36;
      lVar26 = lVar42;
      lVar40 = lVar33;
      do {
        lVar34 = 0;
        pfVar30 = (float *)((long)pfVar31 + (ulong)(uint)((int)(uVar19 >> 0x1f) << 5));
        do {
          fVar4 = pfVar24[uVar20] * *pfVar30;
          pfVar30 = pfVar30 + (ulong)(~uVar18 >> 0x1f) * 2 + -1;
          auVar45 = vinsertps_avx(ZEXT416(*(uint *)(lVar26 + lVar34 * 4)),
                                  ZEXT416(*(uint *)(lVar40 + lVar34 * 4)),0x10);
          lVar34 = lVar34 + 1;
          auVar69._0_4_ = fVar4 * auVar45._0_4_;
          auVar69._4_4_ = fVar4 * auVar45._4_4_;
          auVar69._8_4_ = fVar4 * auVar45._8_4_;
          auVar69._12_4_ = fVar4 * auVar45._12_4_;
          auVar45 = vandps_avx(auVar69,auVar64);
          auVar45 = vmovlhps_avx(auVar69,auVar45);
          auVar66._0_4_ = auVar76._0_4_ + auVar45._0_4_;
          auVar66._4_4_ = auVar76._4_4_ + auVar45._4_4_;
          auVar66._8_4_ = auVar76._8_4_ + auVar45._8_4_;
          auVar66._12_4_ = auVar76._12_4_ + auVar45._12_4_;
          auVar76 = ZEXT1664(auVar66);
        } while (lVar34 != 9);
        uVar22 = uVar22 + 0x18;
        uVar20 = uVar20 + (ulong)(-1 < (int)uVar29) * 2 + -1;
        lVar40 = lVar40 + 0x60;
        lVar26 = lVar26 + 0x60;
      } while (uVar22 < uVar29 * 0x18 + 0x198);
      uVar29 = uVar29 + 5;
      uVar36 = uVar36 + 0x78;
      fVar4 = gauss_s2_arr[lVar39];
      auVar16._4_4_ = fVar4;
      auVar16._0_4_ = fVar4;
      auVar16._8_4_ = fVar4;
      auVar16._12_4_ = fVar4;
      auVar48 = vmulps_avx512vl(auVar66,auVar16);
      lVar39 = lVar39 + 1;
      auVar67._0_4_ = auVar48._0_4_ * auVar48._0_4_;
      auVar67._4_4_ = auVar48._4_4_ * auVar48._4_4_;
      auVar67._8_4_ = auVar48._8_4_ * auVar48._8_4_;
      auVar67._12_4_ = auVar48._12_4_ * auVar48._12_4_;
      auVar46 = vshufpd_avx(auVar48,auVar48,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar41) = auVar48;
      lVar41 = lVar41 + 4;
      lVar33 = lVar33 + 0x1e0;
      lVar42 = lVar42 + 0x1e0;
      auVar45 = vmovshdup_avx(auVar67);
      auVar47 = vfmadd231ss_fma(auVar45,auVar48,auVar48);
      auVar45 = vshufps_avx(auVar48,auVar48,0xff);
      auVar46 = vfmadd213ss_fma(auVar46,auVar46,auVar47);
      auVar45 = vfmadd213ss_fma(auVar45,auVar45,auVar46);
      fVar59 = fVar59 + auVar45._0_4_;
    } while (local_b0 != (int)lVar39);
    lVar23 = lVar23 + 0x14;
    uVar19 = (ulong)(uVar18 + 5);
  } while ((int)uVar18 < 3);
  if (fVar59 < 0.0) {
    fVar59 = sqrtf(fVar59);
  }
  else {
    auVar45 = vsqrtss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
    fVar59 = auVar45._0_4_;
  }
  lVar23 = 0;
  auVar76 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar59)));
  do {
    auVar57 = vmulps_avx512f(auVar76,*(undefined1 (*) [64])(ipoint->descriptor + lVar23));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar23) = auVar57;
    lVar23 = lVar23 + 0x10;
  } while (lVar23 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_2_1_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=1, k_count+=1) {
                int k0 = k + 0;
                int k_count0 = k_count + 0;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);

            for (int k=-12, k_count=0; k<12; k+=1, k_count+=1) {
                int k0 = k + 0;
                int k_count0 = k_count + 0;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}